

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O0

void compare_services(vector<t_service_*,_std::allocator<t_service_*>_> *newServices,
                     vector<t_service_*,_std::allocator<t_service_*>_> *oldServices)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *pptVar3;
  reference pptVar4;
  undefined4 extraout_var_00;
  t_service *ptVar5;
  pointer ppVar6;
  t_service *ptVar7;
  undefined8 uVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  vector<t_function_*,_std::allocator<t_function_*>_> *newFunctionList;
  vector<t_function_*,_std::allocator<t_function_*>_> *oldFunctionList;
  undefined1 local_110 [8];
  string newExtendsName;
  string oldExtendsName;
  t_service *newServiceExtends;
  t_service *oldServiceExtends;
  _Self local_b8;
  iterator newServiceMapIt;
  string oldServiceName;
  t_service *newService;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_service_*,_std::allocator<t_service_*>_> *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  newServiceMap;
  const_iterator oldServiceIt;
  vector<t_service_*,_std::allocator<t_service_*>_> *oldServices_local;
  vector<t_service_*,_std::allocator<t_service_*>_> *newServices_local;
  
  __gnu_cxx::
  __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
  __normal_iterator((__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                     *)&newServiceMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
         *)&__range1);
  __end1 = std::vector<t_service_*,_std::allocator<t_service_*>_>::begin(newServices);
  newService = (t_service *)std::vector<t_service_*,_std::allocator<t_service_*>_>::end(newServices)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                                     *)&newService), bVar1) {
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
              ::operator*(&__end1);
    ptVar5 = *pptVar4;
    iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
    pptVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
                            *)&__range1,(key_type *)CONCAT44(extraout_var,iVar2));
    *pptVar3 = ptVar5;
    __gnu_cxx::
    __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    operator++(&__end1);
  }
  newServiceMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::vector<t_service_*,_std::allocator<t_service_*>_>::begin(oldServices);
  while( true ) {
    oldServiceName.field_2._8_8_ =
         std::vector<t_service_*,_std::allocator<t_service_*>_>::end(oldServices);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                        *)&newServiceMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                        *)((long)&oldServiceName.field_2 + 8));
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
              ::operator*((__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                           *)&newServiceMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar2 = (*((*pptVar4)->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string
              ((string *)&newServiceMapIt,(string *)CONCAT44(extraout_var_00,iVar2));
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
                 *)&__range1,(key_type *)&newServiceMapIt);
    oldServiceExtends =
         (t_service *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
                *)&__range1);
    bVar1 = std::operator==(&local_b8,(_Self *)&oldServiceExtends);
    if (bVar1) {
      std::__cxx11::string::c_str();
      thrift_audit_failure("New Thrift file is missing a service %s\n");
    }
    else {
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                ::operator*((__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                             *)&newServiceMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ptVar5 = t_service::get_extends(*pptVar4);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>
               ::operator->(&local_b8);
      ptVar7 = t_service::get_extends(ppVar6->second);
      if (ptVar5 != (t_service *)0x0) {
        if ((ptVar5 == (t_service *)0x0) || (ptVar7 != (t_service *)0x0)) {
          iVar2 = (*(ptVar5->super_t_type).super_t_doc._vptr_t_doc[3])();
          std::__cxx11::string::string
                    ((string *)(newExtendsName.field_2._M_local_buf + 8),
                     (string *)CONCAT44(extraout_var_01,iVar2));
          iVar2 = (*(ptVar7->super_t_type).super_t_doc._vptr_t_doc[3])();
          std::__cxx11::string::string
                    ((string *)local_110,(string *)CONCAT44(extraout_var_02,iVar2));
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_110,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&newExtendsName.field_2 + 8));
          if (bVar1) {
            uVar8 = std::__cxx11::string::c_str();
            thrift_audit_failure("Change in Service inheritance for %s\n",uVar8);
          }
          std::__cxx11::string::~string((string *)local_110);
          std::__cxx11::string::~string((string *)(newExtendsName.field_2._M_local_buf + 8));
        }
        else {
          uVar8 = std::__cxx11::string::c_str();
          thrift_audit_failure("Change in Service inheritance for %s\n",uVar8);
        }
      }
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>
               ::operator->(&local_b8);
      newFunctionList = t_service::get_functions(ppVar6->second);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                ::operator*((__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                             *)&newServiceMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      oldFunctionList = t_service::get_functions(*pptVar4);
      compare_functions(newFunctionList,oldFunctionList);
    }
    std::__cxx11::string::~string((string *)&newServiceMapIt);
    __gnu_cxx::
    __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    operator++((__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                *)&newServiceMap._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_service_*>_>_>
          *)&__range1);
  return;
}

Assistant:

void compare_services(const std::vector<t_service*>& newServices, const std::vector<t_service*>& oldServices)
{
   std::vector<t_service*>::const_iterator oldServiceIt;

   std::map<std::string, t_service*> newServiceMap;
   for(auto newService : newServices)
   {
      newServiceMap[newService->get_name()] = newService;
   }


   for(oldServiceIt = oldServices.begin(); oldServiceIt != oldServices.end(); oldServiceIt++)
   {
      const std::string oldServiceName = (*oldServiceIt)->get_name();
      auto newServiceMapIt = newServiceMap.find(oldServiceName);

      if(newServiceMapIt == newServiceMap.end())
      {
         thrift_audit_failure("New Thrift file is missing a service %s\n", oldServiceName.c_str());
      }
      else
      {
         t_service* oldServiceExtends = (*oldServiceIt)->get_extends();
         t_service* newServiceExtends = (newServiceMapIt->second)->get_extends();

         if(oldServiceExtends == nullptr)
         {
            // It is fine to add extends. So if service in older thrift did not have any extends, we are fine.
            // DO Nothing
         }
         else if(oldServiceExtends != nullptr && newServiceExtends == nullptr)
         {
            thrift_audit_failure("Change in Service inheritance for %s\n", oldServiceName.c_str());
         }
         else
         {
            std::string oldExtendsName = oldServiceExtends->get_name();
            std::string newExtendsName = newServiceExtends->get_name();

            if( newExtendsName != oldExtendsName)
            {
               thrift_audit_failure("Change in Service inheritance for %s\n", oldServiceName.c_str());
            }
         }

         compare_functions((newServiceMapIt->second)->get_functions(), (*oldServiceIt)->get_functions());
      }

   }

}